

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::StoreInst::display(StoreInst *this,ostream *o)

{
  std::__ostream_insert<char,std::char_traits<char>>(o,"store ",6);
  (**(this->val).super_Displayable._vptr_Displayable)(&this->val,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," to ",4);
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest,o);
  return;
}

Assistant:

void StoreInst::display(std::ostream& o) const {
  o << "store " << val << " to " << dest;
}